

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-bwt.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint k;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  string path;
  cw_bwt cwbwt;
  string local_2f0;
  string local_2d0;
  cw_bwt local_2b0;
  undefined1 local_168 [112];
  pointer local_f8;
  pointer puStack_f0;
  undefined1 auStack_e8 [16];
  undefined1 auStack_d8 [16];
  vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> local_90;
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  vStack_78;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  vStack_60;
  pointer local_48;
  pointer puStack_40;
  pointer puStack_38;
  
  if (0xfffffffd < argc - 5U) {
    lVar1 = std::chrono::_V2::system_clock::now();
    auStack_e8 = ZEXT816(0);
    local_168._80_16_ = (undefined1  [16])0x0;
    local_168._48_8_ = (pointer)0x0;
    local_168._56_8_ = (pointer)0x0;
    local_168._64_8_ = (pointer)0x0;
    local_168._72_8_ = (pointer)0x0;
    local_f8 = (pointer)0x0;
    puStack_f0 = (pointer)0x0;
    auStack_d8 = (undefined1  [16])0x0;
    local_90.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_78.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_78.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_78.
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_60.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_60.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_60.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48 = (pointer)0x0;
    puStack_40 = (pointer)0x0;
    puStack_38 = (pointer)0x0;
    if (argc == 3) {
      std::__cxx11::string::string((string *)&local_2f0,argv[1],(allocator *)&local_2b0);
      bwtil::cw_bwt::cw_bwt(&local_2b0,&local_2f0,path,true);
    }
    else {
      std::__cxx11::string::string((string *)&local_2f0,argv[1],(allocator *)&local_2b0);
      k = atoi(argv[3]);
      bwtil::cw_bwt::cw_bwt(&local_2b0,&local_2f0,path,k,true);
    }
    bwtil::cw_bwt::operator=((cw_bwt *)local_168,&local_2b0);
    if (local_2b0.lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.lengths.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_2b0.frequencies);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector(&local_2b0.dynStrings);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
              (&local_2b0.partial_sums);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_2b0.ca.edges);
    if (local_2b0.ca.prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.ca.prefix_nr.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2b0.ca.remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.ca.remapping.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2b0.ca.inverse_remapping.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.ca.inverse_remapping.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_2d0,argv[2],(allocator *)&local_2b0);
    bwtil::cw_bwt::toFile((cw_bwt *)local_168,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    bwtil::printRSSstat(local_168._24_8_ + 1);
    lVar2 = std::chrono::_V2::system_clock::now();
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (double)(lVar2 - lVar1) * 1e-09;
    uVar4 = vcvttsd2usi_avx512f(auVar5);
    if (uVar4 < 0xe10) {
      if (uVar4 < 0x3c) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc)
        ;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds.",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc)
        ;
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds. (",0xb);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"m ",2);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total time: ",0xc);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds. (",0xb);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"h ",2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"m ",2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&vStack_60);
    std::
    vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ::~vector(&vStack_78);
    std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector(&local_90);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)(auStack_e8 + 8));
    if (local_f8 != (pointer)0x0) {
      operator_delete(local_f8);
    }
    if ((pointer)local_168._72_8_ != (pointer)0x0) {
      operator_delete((void *)local_168._72_8_);
    }
    if ((pointer)local_168._48_8_ != (pointer)0x0) {
      operator_delete((void *)local_168._48_8_);
    }
    return 0;
  }
  std::operator<<((ostream *)&std::cout,
                  "*** context-wise BWT construction in compressed space ***\n");
  std::operator<<((ostream *)&std::cout,"Usage: cw-bwt text_file bwt_file [k]\n");
  std::operator<<((ostream *)&std::cout,"where:\n");
  std::operator<<((ostream *)&std::cout,
                  "- text_file is the input text file. Input file must not contain a 0x0 byte since the algorithm uses it as text terminator.\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "- bwt_file is the output bwt file. This output file will contain a 0x0 terminator and thus will be 1 byte longer than the input file.\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "- k (automatically detected if not specified) is the entropy order (context length).\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "WARNING: for high values of k, the memory requirements approach n log n. If you specify k, choose it carefully!\n"
                 );
  std::operator<<((ostream *)&std::cout,"For more informations, read the file README.\n");
  exit(0);
}

Assistant:

int main(int argc,char** argv) {

#ifdef DEBUG
	 cout << "\n ****** DEBUG MODE ******\n\n";
#endif

	if(argc != 3 and argc != 4){
		cout << "*** context-wise BWT construction in compressed space ***\n";
		cout << "Usage: cw-bwt text_file bwt_file [k]\n";
		cout << "where:\n";
		cout << "- text_file is the input text file. Input file must not contain a 0x0 byte since the algorithm uses it as text terminator.\n";
		cout << "- bwt_file is the output bwt file. This output file will contain a 0x0 terminator and thus will be 1 byte longer than the input file.\n";
		cout << "- k (automatically detected if not specified) is the entropy order (context length).\n";
		cout << "WARNING: for high values of k, the memory requirements approach n log n. If you specify k, choose it carefully!\n";
		cout << "For more informations, read the file README.\n";
		exit(0);
	}

    using std::chrono::high_resolution_clock;
    using std::chrono::duration_cast;
    using std::chrono::duration;

    auto t1 = high_resolution_clock::now();

	cw_bwt cwbwt;

	/*
	 * Note: in this example, the text is loaded from disk and the bwt is directly saved to disk. The total RAM occupancy is therefore COMPRESSED, i.e.
	 * comparable to the size of the compressed input text file.
	 *
	 * It is possible (see comments below) also to build the bwt from/to strings, but in this way also the input/output strings will be stored in memory,
	 * resulting in higher RAM requirements.
	 *
	 * If you want to keep RAM usage to a minimum, it is recommended that you proceed as follows:
	 *
	 * 1) save your text (string/array) to disk
	 * 2) free memory
	 * 3) run cw-bwt loading the text from the file created in step 1) (see below)
	 * 4) save directly the bwt to disk (see below)
	 * 5) free memory
	 * 6) load in RAM the bwt created in step 4)
	 *
	 */

	//build bwt from a text file:

	if(argc==3){//k autodetected
		string path(argv[1]);
		//cw_bwt::path means that the first argument has to be interpreted as a file path rather than a text string
		cwbwt = cw_bwt(path,cw_bwt::path,true);
	}
	if(argc==4){//the user has specified k
		string path(argv[1]);
		cwbwt = cw_bwt(path,cw_bwt::path,atoi(argv[3]),true);
	}
	/*
	 * If, instead, you want to compute the bwt of a string, create a cw_bwt object as follows:
	 *
	 *
	 * string str = "mississippi";
	 * cwbwt = cw_bwt(str,cw_bwt::text); // optimal k autodetected
	 *
	 * or
	 *
	 * cwbwt = cw_bwt(str,cw_bwt::text, your_k_value,true); // you choose k
	 *
	 * However, this requires more space in RAM since the input text string is kept in memory together with the structures of cwbwt
	 *
	 */

	//save to file the bwt without occupying additional RAM
	cwbwt.toFile(argv[2]);

	/*
	 * If, instead, you want a string object containing the bwt, call
	 *
	 * string bwt = cwbwt.toString();
	 *
	 * However, this requires more space in RAM since the string bwt is kept in memory together with the structures of cwbwt
	 * WARNING: if you directly print cwbwt.toString(), you won't see the terminator character since it is a 0x0 byte.
	 *
	 */

	printRSSstat(cwbwt.length());

	auto t2 = high_resolution_clock::now();
	ulint total = duration_cast<duration<double, std::ratio<1>>>(t2 - t1).count();

	if(total>=3600){

		uint h = total/3600;
		uint m = (total%3600)/60;
		uint s = (total%3600)%60;

		cout << "Total time: " << total << " seconds. ("<< h << "h " << m << "m " << s << "s" << ")"<<endl;

	}else if (total>=60){

		uint m = total/60;
		uint s = total%60;

		cout << "Total time: " << total << " seconds. ("<< m << "m " << s << "s" << ")"<<endl;

	}else{

		cout << "Total time: " << total << " seconds." << endl;

	}
 }